

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.h
# Opt level: O3

uint uWS::HttpParser::getHeaders(char *postPaddedBuffer,char *end,Header *headers,BloomFilter *bf)

{
  void *pvVar1;
  byte bVar2;
  uint i;
  int iVar3;
  uint uVar4;
  byte *__s;
  byte *pbVar5;
  
  iVar3 = 0;
  pbVar5 = (byte *)postPaddedBuffer;
  do {
    bVar2 = *pbVar5;
    __s = pbVar5;
    if (' ' < (char)bVar2 && bVar2 != 0x3a) {
      do {
        *__s = bVar2 | 0x20;
        bVar2 = __s[1];
        __s = __s + 1;
        if (bVar2 == 0x3a) break;
      } while (' ' < (char)bVar2);
    }
    if (bVar2 == 0xd) {
      uVar4 = 0;
      if (((iVar3 != 0) && (__s != (byte *)end)) && (__s[1] == 10)) {
        uVar4 = ((int)__s - (int)postPaddedBuffer) + 2;
        (headers->key)._M_len = 0;
        (headers->key)._M_str = (char *)0x0;
      }
      return uVar4;
    }
    (headers->key)._M_len = (long)__s - (long)pbVar5;
    (headers->key)._M_str = (char *)pbVar5;
    pbVar5 = __s;
    do {
      bVar2 = __s[1];
      __s = __s + 1;
      pbVar5 = pbVar5 + 1;
      if (bVar2 == 0xd) break;
    } while (bVar2 == 0x3a || (char)bVar2 < '!');
    pvVar1 = memchr(__s,0xd,(long)end - (long)pbVar5);
    if (pvVar1 == (void *)0x0) {
      return 0;
    }
    if (*(char *)((long)pvVar1 + 1) != '\n') {
      return 0;
    }
    (headers->value)._M_len = (long)pvVar1 - (long)pbVar5;
    (headers->value)._M_str = (char *)__s;
    pbVar5 = (byte *)((long)pvVar1 + 2);
    headers = headers + 1;
    iVar3 = iVar3 + 1;
    if (iVar3 == 0x32) {
      return 0;
    }
  } while( true );
}

Assistant:

static unsigned int getHeaders(char *postPaddedBuffer, char *end, struct HttpRequest::Header *headers, BloomFilter *bf) {
        char *preliminaryKey, *preliminaryValue, *start = postPaddedBuffer;

        for (unsigned int i = 0; i < HttpRequest::MAX_HEADERS; i++) {
            for (preliminaryKey = postPaddedBuffer; (*postPaddedBuffer != ':') & (*postPaddedBuffer > 32); *(postPaddedBuffer++) |= 32);
            if (*postPaddedBuffer == '\r') {
                if ((postPaddedBuffer != end) & (postPaddedBuffer[1] == '\n') & (i > 0)) {
                    headers->key = std::string_view(nullptr, 0);
                    return (unsigned int) ((postPaddedBuffer + 2) - start);
                } else {
                    return 0;
                }
            } else {
                headers->key = std::string_view(preliminaryKey, (size_t) (postPaddedBuffer - preliminaryKey));
                for (postPaddedBuffer++; (*postPaddedBuffer == ':' || *postPaddedBuffer < 33) && *postPaddedBuffer != '\r'; postPaddedBuffer++);
                preliminaryValue = postPaddedBuffer;
                postPaddedBuffer = (char *) memchr(postPaddedBuffer, '\r', end - postPaddedBuffer);
                if (postPaddedBuffer && postPaddedBuffer[1] == '\n') {
                    headers->value = std::string_view(preliminaryValue, (size_t) (postPaddedBuffer - preliminaryValue));
                    postPaddedBuffer += 2;
                    headers++;
                } else {
                    return 0;
                }
            }
        }
        return 0;
    }